

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_CELL pRVar3;
  bool bVar4;
  REF_GRID pRVar5;
  REF_INT *pRVar6;
  REF_STATUS RVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  REF_INT *c2n;
  undefined8 uVar12;
  ulong uVar13;
  FILE *pFVar14;
  REF_STATUS unaff_EBP;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  REF_INT RVar18;
  int iVar19;
  int iVar20;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT nodes [27];
  int local_f4;
  FILE *local_f0;
  uint local_e4;
  ulong local_e0;
  void *local_d8;
  REF_INT *local_d0;
  REF_GRID local_c8;
  REF_INT *local_c0;
  ulong local_b8;
  void *local_b0;
  int local_a8;
  int local_a4;
  uint local_a0;
  int local_9c;
  
  if (ref_grid->twod == 0) {
    pcVar16 = "expected twod convention grid";
    uVar12 = 0xa42;
LAB_00114a69:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar12
           ,"ref_export_i_like_cfd_grid",pcVar16);
    RVar7 = 1;
  }
  else {
    pRVar1 = ref_grid->node;
    local_f0 = fopen(filename,"w");
    if (local_f0 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar16 = "unable to open file";
      uVar12 = 0xa46;
    }
    else {
      if ((long)pRVar1->max < 0) {
        unaff_EBP = 1;
        pcVar16 = "malloc o2n of REF_INT negative";
LAB_00114ad7:
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa48,"ref_export_i_like_cfd_grid",pcVar16);
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc((long)pRVar1->max << 2);
        if (pvVar9 == (void *)0x0) {
          unaff_EBP = 2;
          pcVar16 = "malloc o2n of REF_INT NULL";
          goto LAB_00114ad7;
        }
        bVar4 = true;
        if (0 < pRVar1->max) {
          lVar10 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + lVar10 * 4) = 0xffffffff;
            lVar10 = lVar10 + 1;
          } while (lVar10 < pRVar1->max);
        }
      }
      if (!bVar4) {
        return unaff_EBP;
      }
      if ((long)pRVar1->max < 0) {
        unaff_EBP = 1;
        pcVar16 = "malloc n2o of REF_INT negative";
LAB_00114b56:
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa49,"ref_export_i_like_cfd_grid",pcVar16);
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = malloc((long)pRVar1->max << 2);
        if (pvVar11 == (void *)0x0) {
          unaff_EBP = 2;
          pcVar16 = "malloc n2o of REF_INT NULL";
          goto LAB_00114b56;
        }
        bVar4 = true;
        if (0 < pRVar1->max) {
          lVar10 = 0;
          do {
            *(undefined4 *)((long)pvVar11 + lVar10 * 4) = 0xffffffff;
            lVar10 = lVar10 + 1;
          } while (lVar10 < pRVar1->max);
        }
      }
      pFVar14 = local_f0;
      if (!bVar4) {
        return unaff_EBP;
      }
      if (pRVar1->max < 1) {
        uVar17 = 0;
      }
      else {
        pRVar2 = pRVar1->global;
        lVar10 = 0;
        uVar17 = 0;
        do {
          if (-1 < pRVar2[lVar10]) {
            *(uint *)((long)pvVar9 + lVar10 * 4) = uVar17;
            *(int *)((long)pvVar11 + (long)(int)uVar17 * 4) = (int)lVar10;
            uVar17 = uVar17 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pRVar1->max);
      }
      local_d8 = pvVar9;
      local_c8 = ref_grid;
      fprintf(local_f0,"%d %d %d\n",(ulong)uVar17,(ulong)(uint)ref_grid->cell[3]->n,
              (ulong)(uint)ref_grid->cell[6]->n);
      if (0 < (int)uVar17) {
        uVar15 = 0;
        do {
          lVar10 = (long)*(int *)((long)pvVar11 + uVar15 * 4);
          fprintf(pFVar14,"%.16E %.16E\n",pRVar1->real[lVar10 * 0xf],pRVar1->real[lVar10 * 0xf + 1])
          ;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      pRVar5 = local_c8;
      pRVar3 = local_c8->cell[3];
      iVar20 = 0;
      local_b0 = pvVar11;
      if (0 < pRVar3->max) {
        RVar18 = 0;
        iVar20 = 0;
        do {
          RVar7 = ref_cell_nodes(pRVar3,RVar18,&local_a8);
          if (RVar7 == 0) {
            iVar20 = iVar20 + 1;
            fprintf(pFVar14,"%d %d %d\n",(ulong)(*(int *)((long)local_d8 + (long)local_a8 * 4) + 1),
                    (ulong)(*(int *)((long)local_d8 + (long)local_a4 * 4) + 1),
                    (ulong)(*(int *)((long)local_d8 + (long)(int)local_a0 * 4) + 1));
          }
          RVar18 = RVar18 + 1;
        } while (RVar18 < pRVar3->max);
      }
      pvVar9 = local_d8;
      pFVar14 = local_f0;
      if (iVar20 != pRVar3->n) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa61,"ref_export_i_like_cfd_grid","triangle miscount",(long)iVar20,(long)pRVar3->n);
        return 1;
      }
      pRVar3 = pRVar5->cell[6];
      if (0 < pRVar3->max) {
        iVar20 = 0;
        do {
          RVar7 = ref_cell_nodes(pRVar3,iVar20,&local_a8);
          if (RVar7 == 0) {
            fprintf(pFVar14,"%d %d %d %d\n",(ulong)(*(int *)((long)pvVar9 + (long)local_a8 * 4) + 1)
                    ,(ulong)(*(int *)((long)pvVar9 + (long)local_a4 * 4) + 1),
                    (ulong)(*(int *)((long)pvVar9 + (long)(int)local_a0 * 4) + 1),
                    (ulong)(*(int *)((long)pvVar9 + (long)local_9c * 4) + 1));
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 < pRVar3->max);
      }
      iVar20 = pRVar3->n;
      if ((long)iVar20 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa6a,"ref_export_i_like_cfd_grid","quad miscount",0,(long)iVar20);
        unaff_EBP = 1;
      }
      if (iVar20 != 0) {
        return unaff_EBP;
      }
      pRVar3 = local_c8->cell[0];
      uVar17 = ref_cell_id_range(pRVar3,local_c8->mpi,(REF_INT *)&local_e4,&local_f4);
      pFVar14 = local_f0;
      if (uVar17 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa6e,"ref_export_i_like_cfd_grid",(ulong)uVar17,"id range");
        return uVar17;
      }
      fprintf(local_f0,"%d\n",(ulong)((local_f4 - local_e4) + 1));
      if ((int)local_e4 <= local_f4) {
        uVar17 = local_e4;
        do {
          if (pRVar3->max < 1) {
            uVar15 = 1;
          }
          else {
            iVar20 = 0;
            iVar19 = 0;
            do {
              RVar7 = ref_cell_nodes(pRVar3,iVar20,&local_a8);
              iVar19 = iVar19 + (uint)(local_a0 == uVar17 && RVar7 == 0);
              iVar20 = iVar20 + 1;
            } while (iVar20 < pRVar3->max);
            uVar15 = (ulong)(iVar19 + 1);
            pFVar14 = local_f0;
          }
          fprintf(pFVar14,"%d\n",uVar15);
          bVar4 = (int)uVar17 < local_f4;
          uVar17 = uVar17 + 1;
        } while (bVar4);
      }
      uVar17 = pRVar3->n;
      if ((int)uVar17 < 0) {
        pcVar16 = "malloc c2n of REF_INT negative";
        uVar12 = 0xa7a;
        goto LAB_00114a69;
      }
      c2n = (REF_INT *)malloc((ulong)uVar17 * 8);
      if (c2n == (REF_INT *)0x0) {
        pcVar16 = "malloc c2n of REF_INT NULL";
        uVar12 = 0xa7a;
      }
      else {
        local_d0 = (REF_INT *)malloc((ulong)uVar17 << 2);
        if (local_d0 != (REF_INT *)0x0) {
          pFVar14 = local_f0;
          uVar17 = local_e4;
          pRVar6 = c2n;
          if ((int)local_e4 <= local_f4) {
            do {
              local_c0 = pRVar6;
              if (pRVar3->max < 1) {
                local_e0 = 0;
              }
              else {
                RVar18 = 0;
                local_e0 = 0;
                do {
                  RVar7 = ref_cell_nodes(pRVar3,RVar18,&local_a8);
                  if ((RVar7 == 0) && (local_a0 == uVar17)) {
                    uVar8 = ref_grid_orient_edg(local_c8,&local_a8);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0xa80,"ref_export_i_like_cfd_grid",(ulong)uVar8,"orient based on tri")
                      ;
                      return uVar8;
                    }
                    iVar20 = (int)local_e0;
                    c2n[iVar20 * 2] = local_a8;
                    c2n[iVar20 * 2 + 1] = local_a4;
                    local_e0 = (ulong)(iVar20 + 1);
                    pFVar14 = local_f0;
                  }
                  RVar18 = RVar18 + 1;
                } while (RVar18 < pRVar3->max);
              }
              pRVar6 = local_d0;
              if (0 < (REF_INT)local_e0) {
                RVar7 = ref_export_order_segments((REF_INT)local_e0,c2n,local_d0);
                pvVar9 = local_d8;
                pFVar14 = local_f0;
                if (RVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0xa87,"ref_export_i_like_cfd_grid",1,"order");
                  return 1;
                }
                local_b8 = (ulong)uVar17;
                fprintf(local_f0,"%d\n",
                        (ulong)(*(int *)((long)local_d8 + (long)c2n[(long)*pRVar6 * 2] * 4) + 1));
                uVar15 = local_e0 & 0xffffffff;
                if ((int)local_e0 < 2) {
                  uVar15 = 1;
                }
                uVar13 = 0;
                do {
                  fprintf(pFVar14,"%d\n",
                          (ulong)(*(int *)((long)pvVar9 +
                                          (long)local_c0[(long)local_d0[uVar13] * 2 + 1] * 4) + 1));
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
                uVar17 = (uint)local_b8;
                c2n = local_c0;
              }
              bVar4 = (int)uVar17 < local_f4;
              uVar17 = uVar17 + 1;
              pRVar6 = local_c0;
            } while (bVar4);
          }
          free(local_d0);
          free(c2n);
          if (local_b0 != (void *)0x0) {
            free(local_b0);
          }
          if (local_d8 != (void *)0x0) {
            free(local_d8);
          }
          fclose(pFVar14);
          return 0;
        }
        pcVar16 = "malloc order of REF_INT NULL";
        uVar12 = 0xa7b;
        local_d0 = (REF_INT *)0x0;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar12
           ,"ref_export_i_like_cfd_grid",pcVar16);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,
                                                     const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o, *c2n, *order;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT min_id, max_id, id;
  REF_INT ntri, nquad, nedge, edge;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "%d %d %d\n", nnode, ref_cell_n(ref_grid_tri(ref_grid)),
          ref_cell_n(ref_grid_qua(ref_grid)));

  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]));
  }

  ref_cell = ref_grid_tri(ref_grid);
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_cell = ref_grid_qua(ref_grid);
  nquad = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1, o2n[nodes[3]] + 1);
  }
  REIS(nquad, ref_cell_n(ref_cell), "quad miscount");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "id range");
  fprintf(f, "%d\n", max_id - min_id + 1);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        nedge++;
      }
    }
    fprintf(f, "%d\n", nedge + 1); /* +1, both end points */
  }

  ref_malloc(c2n, 2 * ref_cell_n(ref_cell), REF_INT);
  ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        RSS(ref_grid_orient_edg(ref_grid, nodes), "orient based on tri");
        c2n[0 + 2 * nedge] = nodes[0];
        c2n[1 + 2 * nedge] = nodes[1];
        nedge++;
      }
    }
    if (nedge > 0) {
      RSS(ref_export_order_segments(nedge, c2n, order), "order");
      fprintf(f, "%d\n", o2n[c2n[0 + 2 * order[0]]] + 1);
      for (edge = 0; edge < nedge; edge++) {
        fprintf(f, "%d\n", o2n[c2n[1 + 2 * order[edge]]] + 1);
      }
    }
  }

  ref_free(order);
  ref_free(c2n);
  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}